

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O0

HintSource *
HintSource::from_json
          (Json *json,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
          *nodes)

{
  initializer_list<unsigned_short> __l;
  undefined8 node_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  Position PVar4;
  const_reference pvVar5;
  mapped_type *ppWVar6;
  HintSource *this;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_3b8;
  string local_3a0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_380;
  bool local_362;
  allocator<char> local_361;
  key_type local_360;
  allocator<char> local_339;
  key_type local_338;
  allocator<char> local_311;
  key_type local_310;
  allocator<char> local_2e9;
  key_type local_2e8;
  undefined1 local_2c8 [8];
  string orientation_str;
  key_type local_2a0;
  allocator<char> local_279;
  key_type local_278;
  Position local_257;
  allocator<char> local_251;
  key_type local_250;
  allocator<char> local_229;
  key_type local_228;
  unsigned_short local_202;
  iterator local_200;
  undefined8 local_1f8;
  allocator<char> local_1e9;
  key_type local_1e8;
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  byte local_14a;
  uint8_t local_149;
  Position local_148;
  bool high_palette;
  uint8_t orientation;
  Position position;
  vector<unsigned_short,_std::allocator<unsigned_short>_> map_ids;
  key_type local_120;
  undefined1 local_100 [8];
  string node_id;
  WorldNode *node;
  key_type local_d0;
  byte local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [6];
  bool small_textbox;
  undefined1 local_88 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> text_ids;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string description;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  *nodes_local;
  Json *json_local;
  
  description.field_2._8_8_ = nodes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"description",&local_59);
  pvVar5 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_58);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,pvVar5);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[8],_0>(json,(char (*) [8])"textIds");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"textIds",&local_a9);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_a8);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
              (pvVar5,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"smallTextbox",(allocator<char> *)((long)&node + 7));
  node._6_1_ = 0;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&local_d0,(bool *)((long)&node + 6));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
  node_id.field_2._8_8_ = 0;
  local_aa = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"nodeId",
             (allocator<char> *)
             ((long)&map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::value((string_t *)local_100,json,&local_120,"");
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
  ;
  if (!bVar2) {
    ppWVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                    *)description.field_2._8_8_,(key_type *)local_100);
    node_id.field_2._8_8_ = *ppWVar6;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&position);
  Position::Position(&local_148);
  local_149 = '\0';
  local_14a = 0;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(json,(char (*) [7])0x315b43);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"entity",&local_171);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"mapId",&local_199);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar5,&local_198);
    bVar2 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_array(pvVar5);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"entity",&local_1c1);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&local_1c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"mapId",&local_1e9);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar5,&local_1e8);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_to<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
                (pvVar5,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&position);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"entity",&local_229);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&local_228);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"mapId",&local_251);
      pvVar5 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar5,&local_250);
      local_202 = nlohmann::
                  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_unsigned_short<unsigned_short,_0>(pvVar5);
      local_200 = &local_202;
      local_1f8 = 1;
      __l._M_len = 1;
      __l._M_array = local_200;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&position,__l);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"entity",&local_279);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"position",
               (allocator<char> *)(orientation_str.field_2._M_local_buf + 0xf));
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar5,&local_2a0);
    PVar4 = Position::from_json(pvVar5);
    local_257._0_4_ = PVar4._0_4_;
    local_257._4_2_ = PVar4._4_2_;
    local_148._0_4_ = local_257._0_4_;
    local_148._4_2_ = local_257._4_2_;
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(orientation_str.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"entity",&local_2e9);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_2e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"orientation",&local_311);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar5,&local_310);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,pvVar5
              );
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2c8,"sw");
    if (bVar2) {
      local_149 = '\x02';
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2c8,"se");
      if (bVar2) {
        local_149 = '\x01';
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2c8,"ne");
        if (bVar2) {
          local_149 = '\0';
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2c8,"nw");
          if (bVar2) {
            local_149 = '\x03';
          }
          else {
            iVar3 = std::__cxx11::stoi((string *)local_2c8,(size_t *)0x0,10);
            local_149 = (uint8_t)iVar3;
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"entity",&local_339);
    pvVar5 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"highPalette",&local_361);
    local_362 = false;
    local_14a = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::value<bool,_0>(pvVar5,&local_360,&local_362);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::~string((string *)local_2c8);
  }
  this = (HintSource *)operator_new(0x90);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_380,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
  std::__cxx11::string::string
            ((string *)&local_3a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = local_aa;
  node_00 = node_id.field_2._8_8_;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_3b8,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&position);
  PVar4.half_y = local_148.half_y;
  PVar4.half_z = local_148.half_z;
  PVar4.x = local_148.x;
  PVar4.y = local_148.y;
  PVar4.z = local_148.z;
  PVar4.half_x = local_148.half_x;
  HintSource(this,&local_380,&local_3a0,(WorldNode *)node_00,(bool)(bVar1 & 1),&local_3b8,PVar4,
             local_149,(bool)(local_14a & 1));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_3b8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_380);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&position);
  std::__cxx11::string::~string((string *)local_100);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

HintSource* HintSource::from_json(const Json& json, const std::map<std::string, WorldNode*>& nodes)
{
    std::string description = json.at("description");

    std::vector<uint16_t> text_ids;
    if(json.contains("textIds"))
        json.at("textIds").get_to(text_ids);

    bool small_textbox = json.value("smallTextbox", false);

    WorldNode* node = nullptr;
    std::string node_id = json.value("nodeId", "");
    if(!node_id.empty())
        node = nodes.at(node_id);

    std::vector<uint16_t> map_ids;
    Position position;
    uint8_t orientation = 0;
    bool high_palette = false;
    if(json.contains("entity"))
    {
        if(json.at("entity").at("mapId").is_array())
            json.at("entity").at("mapId").get_to(map_ids);
        else
            map_ids = { json.at("entity").at("mapId") };

        position = Position::from_json(json.at("entity").at("position"));

        std::string orientation_str = json.at("entity").at("orientation");
        if(orientation_str == "sw")
            orientation = ENTITY_ORIENTATION_SW;
        else if(orientation_str == "se")
            orientation = ENTITY_ORIENTATION_SE;
        else if(orientation_str == "ne")
            orientation = ENTITY_ORIENTATION_NE;
        else if(orientation_str == "nw")
            orientation = ENTITY_ORIENTATION_NW;
        else
            orientation = std::stoi(orientation_str);

        high_palette = json.at("entity").value("highPalette", false);
    }

    return new HintSource(text_ids, description, node, small_textbox, map_ids, position, orientation, high_palette);
}